

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O1

bool slang::ast::SFormat::parse
               (string_view str,
               function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText,
               function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
               onArg,function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
                     onError)

{
  byte *pbVar1;
  byte bVar2;
  optional<unsigned_int> oVar3;
  optional<unsigned_int> oVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  byte bVar8;
  ulong uVar9;
  DiagCode DVar10;
  byte *pbVar11;
  int base;
  FormatOptions *pFVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  byte *pbVar16;
  bool bVar17;
  string_view str_00;
  string_view str_01;
  basic_string_view<char,_std::char_traits<char>_> bVar18;
  basic_string_view<char,_std::char_traits<char>_> bVar19;
  size_t pos;
  SmallVector<char,_40UL> text;
  FormatOptions local_c0;
  char local_a8;
  undefined7 uStack_a7;
  intptr_t local_a0;
  _func_void_intptr_t_basic_string_view<char,_std::char_traits<char>_> *local_98;
  size_t local_90;
  FormatOptions *local_88;
  intptr_t local_80;
  long local_78;
  SmallVectorBase<char> local_70 [2];
  
  pbVar11 = (byte *)str._M_str;
  local_90 = str._M_len;
  local_80 = onArg.callable;
  pFVar12 = (FormatOptions *)onArg.callback;
  local_a0 = onText.callable;
  local_98 = onText.callback;
  local_70[0].data_ = local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 0x28;
  local_88 = pFVar12;
  if (local_90 != 0) {
    pbVar1 = pbVar11 + local_90;
    local_78 = 1 - (long)pbVar11;
    pbVar13 = pbVar11;
    do {
      bVar2 = *pbVar13;
      local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = bVar2;
      iVar15 = 0;
      if (bVar2 != 0x25) {
        iVar15 = 2;
        SmallVectorBase<char>::emplace_back<char_const&>(local_70,(char *)&local_c0);
      }
      base = (int)pFVar12;
      pbVar14 = pbVar13 + 1;
      if (bVar2 != 0x25) goto LAB_002fed4f;
      if ((pbVar14 != pbVar1) && (*pbVar14 == 0x25)) {
        local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = 0x25;
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_c0);
        pbVar14 = pbVar13 + 2;
        iVar15 = 2;
        goto LAB_002fed4f;
      }
      local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
      local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
      local_c0.leftJustify = false;
      local_c0.zeroPad = false;
      bVar17 = pbVar14 == pbVar1;
      if (!bVar17) {
        pbVar16 = pbVar13 + local_78;
        bVar5 = false;
        bVar7 = false;
        do {
          if (*pbVar14 == 0x30) {
            if (bVar7) {
LAB_002feafb:
              if ((!bVar17) && ((byte)(*pbVar14 - 0x30) < 10)) {
                str_00._M_str = &local_a8;
                str_00._M_len = (size_t)pbVar14;
                local_c0.width =
                     strToUInt((slang *)(local_90 - (long)pbVar16),str_00,(size_t *)0xa,base);
                uVar9 = (ulong)local_c0.width.super__Optional_base<unsigned_int,_true,_true>.
                               _M_payload.super__Optional_payload_base<unsigned_int> & 0x100000000;
                if (uVar9 != 0) {
                  uVar9 = CONCAT71(uStack_a7,local_a8);
                }
                pbVar14 = pbVar14 + uVar9;
                if (local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged == false) {
                  iVar15 = 1;
                  pFVar12 = (FormatOptions *)0x0;
                  (*onError.callback)(onError.callable,(DiagCode)0x13000b,
                                      (unsigned_long)(pbVar16 + uVar9),0,(optional<char>)0x0);
                  goto LAB_002fed4f;
                }
              }
              break;
            }
            local_c0.zeroPad = true;
            bVar7 = true;
          }
          else {
            if ((*pbVar14 != 0x2d) || (bVar5)) goto LAB_002feafb;
            local_c0.leftJustify = true;
            bVar5 = true;
          }
          pbVar14 = pbVar14 + 1;
          pbVar16 = pbVar16 + 1;
          bVar17 = pbVar14 == pbVar1;
        } while (!bVar17);
      }
      oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)local_c0.precision;
      if ((pbVar14 != pbVar1) && (*pbVar14 == 0x2e)) {
        pbVar14 = pbVar14 + 1;
        if ((pbVar14 == pbVar1) || (9 < (byte)(*pbVar14 - 0x30))) {
          local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_base<unsigned_int,_true,_true>)
               ((ulong)local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffffff00000000);
          oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_base<unsigned_int,_true,_true>)
               (_Optional_base<unsigned_int,_true,_true>)local_c0.precision;
          local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged =
               oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
          bVar17 = local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged == false;
          local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_base<unsigned_int,_true,_true>)
               (_Optional_base<unsigned_int,_true,_true>)oVar4;
          if (bVar17) {
            local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._5_3_ =
                 oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._5_3_;
            local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload =
                 (_Storage<unsigned_int,_true>)0x0;
            local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = true;
          }
        }
        else {
          str_01._M_str = &local_a8;
          str_01._M_len = (size_t)pbVar14;
          local_c0.precision =
               strToUInt((slang *)(pbVar1 + -(long)pbVar14),str_01,(size_t *)0xa,base);
          uVar9 = (ulong)local_c0.precision.super__Optional_base<unsigned_int,_true,_true>.
                         _M_payload.super__Optional_payload_base<unsigned_int> & 0x100000000;
          if (uVar9 != 0) {
            uVar9 = CONCAT71(uStack_a7,local_a8);
          }
          pbVar14 = pbVar14 + uVar9;
          bVar17 = local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged == false;
          if (bVar17) {
            iVar15 = 1;
            pFVar12 = (FormatOptions *)0x0;
            (*onError.callback)(onError.callable,(DiagCode)0x13000b,(long)pbVar14 - (long)pbVar11,0,
                                (optional<char>)0x0);
            goto LAB_002fed4f;
          }
        }
      }
      if (pbVar14 == pbVar1) {
        pFVar12 = (FormatOptions *)0x0;
        (*onError.callback)(onError.callable,(DiagCode)0x2f000b,(long)pbVar13 - (long)pbVar11,
                            (long)pbVar14 - (long)pbVar13,(optional<char>)0x0);
        local_a8 = '%';
        SmallVectorBase<char>::emplace_back<char>(local_70,&local_a8);
        iVar15 = 3;
        goto LAB_002fed4f;
      }
      bVar2 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      uVar6 = tolower((int)(char)bVar2);
      switch(uVar6 & 0xff) {
      case 0x62:
      case 100:
      case 0x68:
      case 0x6f:
      case 0x78:
        if (local_c0.zeroPad == true) {
          local_c0._16_2_ = local_c0._16_2_ & 0xff;
          if (local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged == false) {
            local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload =
                 (_Storage<unsigned_int,_true>)0x0;
            local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = true;
          }
        }
        goto LAB_002fec99;
      case 99:
      case 0x6c:
      case 0x6d:
      case 0x70:
      case 0x75:
      case 0x76:
      case 0x7a:
        bVar8 = 1;
        bVar17 = false;
        break;
      case 0x65:
      case 0x66:
      case 0x67:
        bVar17 = true;
        bVar8 = 0;
        break;
      default:
        pFVar12 = (FormatOptions *)(ulong)(bVar2 | 0x100);
        DVar10.subsystem = SysFuncs;
        DVar10.code = 0x2a;
        goto LAB_002fed2c;
      case 0x73:
      case 0x74:
LAB_002fec99:
        bVar8 = 1;
        bVar17 = true;
      }
      if (local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        if (local_c0.leftJustify != true || bVar17) goto LAB_002fecb6;
LAB_002fed1c:
        pFVar12 = (FormatOptions *)(ulong)(bVar2 | 0x100);
        DVar10.subsystem = SysFuncs;
        DVar10.code = 0x15;
LAB_002fed2c:
        iVar15 = 1;
        (*onError.callback)(onError.callable,DVar10,(long)pbVar13 - (long)pbVar11,
                            (long)pbVar14 - (long)pbVar13,
                            (_Optional_base<char,_true,_true>)SUB82(pFVar12,0));
      }
      else {
        if (!bVar17) goto LAB_002fed1c;
LAB_002fecb6:
        if ((local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged & bVar8) != 0) {
          DVar10.subsystem = SysFuncs;
          DVar10.code = 0x14;
          pFVar12 = (FormatOptions *)0x0;
          goto LAB_002fed2c;
        }
        if ((!bVar17 && local_c0.zeroPad == true) && (char)uVar6 != 'p') goto LAB_002fed1c;
        if (local_70[0].len != 0) {
          bVar18._M_str = local_70[0].data_;
          bVar18._M_len = local_70[0].len;
          (*local_98)(local_a0,bVar18);
          local_70[0].len = 0;
        }
        iVar15 = 0;
        pFVar12 = &local_c0;
        (*(code *)local_88)(local_80,bVar2,(long)pbVar13 - (long)pbVar11,
                            (long)pbVar14 - (long)pbVar13,pFVar12);
      }
LAB_002fed4f:
      if ((iVar15 != 0) && (iVar15 != 2)) {
        if (iVar15 != 3) {
          bVar17 = false;
          goto LAB_002fedbe;
        }
        break;
      }
      pbVar13 = pbVar14;
    } while (pbVar14 != pbVar1);
  }
  bVar17 = true;
  if (local_70[0].len != 0) {
    bVar19._M_str = local_70[0].data_;
    bVar19._M_len = local_70[0].len;
    (*local_98)(local_a0,bVar19);
  }
LAB_002fedbe:
  if (local_70[0].data_ != local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return bVar17;
}

Assistant:

bool parse(std::string_view str, function_ref<void(std::string_view)> onText,
           function_ref<void(char, size_t, size_t, const FormatOptions&)> onArg,
           function_ref<void(DiagCode, size_t, size_t, std::optional<char>)> onError) {
    SmallVector<char> text;
    const char* ptr = str.data();
    const char* end = str.data() + str.length();

    auto err = [&](DiagCode code, const char* curr, std::optional<char> spec = {}) {
        onError(code, size_t(curr - str.data()), size_t(ptr - curr), spec);
    };

    while (ptr != end) {
        const char* start = ptr;
        if (char c = *ptr++; c != '%') {
            text.push_back(c);
            continue;
        }

        // %% collapses to a single %
        if (ptr != end && *ptr == '%') {
            ptr++;
            text.push_back('%');
            continue;
        }

        FormatOptions options;
        while (ptr != end) {
            if (*ptr == '-' && !options.leftJustify) {
                options.leftJustify = true;
                ptr++;
            }
            else if (*ptr == '0' && !options.zeroPad) {
                options.zeroPad = true;
                ptr++;
            }
            else {
                break;
            }
        }

        if (ptr != end && isDecimalDigit(*ptr)) {
            options.width = parseUInt(ptr, end);
            if (!options.width) {
                err(diag::FormatSpecifierInvalidWidth, ptr);
                return false;
            }
        }

        if (ptr != end && *ptr == '.') {
            ptr++;
            if (ptr != end && isDecimalDigit(*ptr)) {
                options.precision = parseUInt(ptr, end);
                if (!options.precision) {
                    err(diag::FormatSpecifierInvalidWidth, ptr);
                    return false;
                }
            }
            else {
                // Precision defaults to zero if we just have a decimal point.
                options.precision = 0;
            }
        }

        if (ptr == end) {
            err(diag::MissingFormatSpecifier, start);
            text.push_back('%');
            break;
        }

        bool widthAllowed = false;
        bool floatAllowed = false;
        char c = *ptr++;
        char spec = charToLower(c);
        switch (spec) {
            case 'h':
            case 'x':
            case 'd':
            case 'o':
            case 'b':
                widthAllowed = true;
                if (options.zeroPad) {
                    options.zeroPad = false;
                    if (!options.width)
                        options.width = 0;
                }
                break;
            case 'e':
            case 'f':
            case 'g':
                widthAllowed = true;
                floatAllowed = true;
                break;
            case 's':
            case 't':
                widthAllowed = true;
                break;
            case 'c':
            case 'u':
            case 'z':
            case 'v':
            case 'p':
            case 'l':
            case 'm':
                break;
            default:
                err(diag::UnknownFormatSpecifier, start, c);
                return false;
        }

        if ((options.width || options.leftJustify) && !widthAllowed) {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (options.precision && !floatAllowed) {
            err(diag::FormatSpecifierNotFloat, start);
            return false;
        }

        // Pattern args allow the zero-pad specifier.
        if (options.zeroPad && !widthAllowed && spec != 'p') {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (!text.empty()) {
            onText(toStringView(text));
            text.clear();
        }

        onArg(c, size_t(start - str.data()), size_t(ptr - start), options);
    }

    if (!text.empty())
        onText(toStringView(text));

    return true;
}